

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void al_backup_dirty_bitmaps(ALLEGRO_DISPLAY *display)

{
  ALLEGRO_BITMAP *bitmap;
  _func_void_ALLEGRO_BITMAP_ptr *p_Var1;
  undefined8 *puVar2;
  ALLEGRO_DISPLAY *pAVar3;
  ulong uVar4;
  
  for (uVar4 = 0; uVar4 < (display->bitmaps)._size; uVar4 = (ulong)((uint)uVar4 + 1)) {
    puVar2 = (undefined8 *)_al_vector_ref(&display->bitmaps,(uint)uVar4);
    bitmap = (ALLEGRO_BITMAP *)*puVar2;
    pAVar3 = _al_get_bitmap_display(bitmap);
    if (((pAVar3 == display) && (bitmap->vt != (ALLEGRO_BITMAP_INTERFACE *)0x0)) &&
       (p_Var1 = bitmap->vt->backup_dirty_bitmap, p_Var1 != (_func_void_ALLEGRO_BITMAP_ptr *)0x0)) {
      (*p_Var1)(bitmap);
    }
  }
  return;
}

Assistant:

void al_backup_dirty_bitmaps(ALLEGRO_DISPLAY *display)
{
   unsigned int i;

   for (i = 0; i < display->bitmaps._size; i++) {
      ALLEGRO_BITMAP **bptr = (ALLEGRO_BITMAP **)_al_vector_ref(&display->bitmaps, i);
      ALLEGRO_BITMAP *bmp = *bptr;
      if (_al_get_bitmap_display(bmp) == display) {
         if (bmp->vt && bmp->vt->backup_dirty_bitmap) {
            bmp->vt->backup_dirty_bitmap(bmp);
	 }
      }
   }
}